

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9ExprFreeTree(jx9_gen_state *pGen,SySet *pNodeSet)

{
  void *pvVar1;
  uint local_24;
  sxu32 n;
  jx9_expr_node **apNode;
  SySet *pNodeSet_local;
  jx9_gen_state *pGen_local;
  
  pvVar1 = pNodeSet->pBase;
  for (local_24 = 0; local_24 < pNodeSet->nUsed; local_24 = local_24 + 1) {
    if (*(long *)((long)pvVar1 + (ulong)local_24 * 8) != 0) {
      ExprFreeTree(pGen,*(jx9_expr_node **)((long)pvVar1 + (ulong)local_24 * 8));
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9ExprFreeTree(jx9_gen_state *pGen, SySet *pNodeSet)
{
	jx9_expr_node **apNode;
	sxu32 n;
	apNode = (jx9_expr_node **)SySetBasePtr(pNodeSet);
	for( n = 0  ; n < SySetUsed(pNodeSet) ; ++n ){
		if( apNode[n] ){
			ExprFreeTree(&(*pGen), apNode[n]);
		}
	}
	return SXRET_OK;
}